

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O3

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::SpecifyConditionVisitor&>
          (RangeSelectExpression *this,SpecifyConditionVisitor *visitor)

{
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SpecifyConditionVisitor&>
            (this->value_,this->value_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SpecifyConditionVisitor&>
            (this->left_,this->left_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SpecifyConditionVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }